

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall
SQLite::Database::createFunction
          (Database *this,char *apFuncName,int aNbArg,bool abDeterministic,void *apApp,
          _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *apFunc,
          _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *apStep,
          _func_void_sqlite3_context_ptr *apFinal,_func_void_void_ptr *apDestroy)

{
  int aRet;
  undefined7 in_register_00000009;
  
  aRet = sqlite3_create_function_v2
                   ((this->mSQLitePtr)._M_t.
                    super___uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>._M_t.
                    super__Tuple_impl<0UL,_sqlite3_*,_SQLite::Database::Deleter>.
                    super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl,apFuncName,aNbArg,
                    (int)CONCAT71(in_register_00000009,abDeterministic) * 0x800 + 1,apApp,apFunc,
                    apStep,apFinal,apDestroy);
  check(this,aRet);
  return;
}

Assistant:

void Database::createFunction(const char*   apFuncName,
                              int           aNbArg,
                              bool          abDeterministic,
                              void*         apApp,
                              void        (*apFunc)(sqlite3_context *, int, sqlite3_value **),
                              void        (*apStep)(sqlite3_context *, int, sqlite3_value **) /* = nullptr */,
                              void        (*apFinal)(sqlite3_context *) /* = nullptr */, // NOLINT(readability/casting)
                              void        (*apDestroy)(void *) /* = nullptr */)
{
    int textRep = SQLITE_UTF8;
    // optimization if deterministic function (e.g. of nondeterministic function random())
    if (abDeterministic)
    {
        textRep = textRep | SQLITE_DETERMINISTIC;
    }
    const int ret = sqlite3_create_function_v2(getHandle(), apFuncName, aNbArg, textRep,
                                               apApp, apFunc, apStep, apFinal, apDestroy);
    check(ret);
}